

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

PendingComponent * __thiscall
cmComputeLinkDepends::MakePendingComponent(cmComputeLinkDepends *this,uint component)

{
  int iVar1;
  reference __k;
  mapped_type *pmVar2;
  vector<int,_std::allocator<int>_> *this_00;
  size_type sVar3;
  const_iterator __first;
  const_iterator __last;
  NodeList *nl;
  PendingComponent *pc;
  uint component_local;
  cmComputeLinkDepends *this_local;
  
  __k = std::vector<int,_std::allocator<int>_>::operator[](&this->ComponentOrder,(ulong)component);
  pmVar2 = std::
           map<int,_cmComputeLinkDepends::PendingComponent,_std::less<int>,_std::allocator<std::pair<const_int,_cmComputeLinkDepends::PendingComponent>_>_>
           ::operator[](&this->PendingComponents,__k);
  pmVar2->Id = component;
  this_00 = &cmComputeComponentGraph::GetComponent(this->CCG,component)->
             super_vector<int,_std::allocator<int>_>;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(this_00);
  if (sVar3 == 1) {
    pmVar2->Count = 1;
  }
  else {
    iVar1 = ComputeComponentCount(this,(NodeList *)this_00);
    pmVar2->Count = iVar1;
  }
  __first = std::vector<int,_std::allocator<int>_>::begin(this_00);
  __last = std::vector<int,_std::allocator<int>_>::end(this_00);
  std::set<int,std::less<int>,std::allocator<int>>::
  insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((set<int,std::less<int>,std::allocator<int>> *)&pmVar2->Entries,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             __first._M_current,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             __last._M_current);
  return pmVar2;
}

Assistant:

cmComputeLinkDepends::PendingComponent&
cmComputeLinkDepends::MakePendingComponent(unsigned int component)
{
  // Create an entry (in topological order) for the component.
  PendingComponent& pc =
    this->PendingComponents[this->ComponentOrder[component]];
  pc.Id = component;
  NodeList const& nl = this->CCG->GetComponent(component);

  if(nl.size() == 1)
    {
    // Trivial components need be seen only once.
    pc.Count = 1;
    }
  else
    {
    // This is a non-trivial strongly connected component of the
    // original graph.  It consists of two or more libraries
    // (archives) that mutually require objects from one another.  In
    // the worst case we may have to repeat the list of libraries as
    // many times as there are object files in the biggest archive.
    // For now we just list them twice.
    //
    // The list of items in the component has been sorted by the order
    // of discovery in the original BFS of dependencies.  This has the
    // advantage that the item directly linked by a target requiring
    // this component will come first which minimizes the number of
    // repeats needed.
    pc.Count = this->ComputeComponentCount(nl);
    }

  // Store the entries to be seen.
  pc.Entries.insert(nl.begin(), nl.end());

  return pc;
}